

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfd_elements_address.cpp
# Opt level: O0

void __thiscall
ElementsAddressFactory_GetSegwitAddressByHash_Test::TestBody
          (ElementsAddressFactory_GetSegwitAddressByHash_Test *this)

{
  bool bVar1;
  undefined1 uVar2;
  undefined1 uVar3;
  undefined1 uVar4;
  char *pcVar5;
  CfdException *anon_var_0_1;
  bool gtest_caught_expected_1;
  ConstCharPtr gtest_msg_1;
  CfdException *anon_var_0;
  bool gtest_caught_expected;
  ConstCharPtr gtest_msg;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  Address address;
  ElementsAddressFactory factory;
  Address *in_stack_fffffffffffff988;
  Address *in_stack_fffffffffffff990;
  undefined4 in_stack_fffffffffffff998;
  undefined1 in_stack_fffffffffffff99c;
  undefined1 in_stack_fffffffffffff99d;
  undefined1 in_stack_fffffffffffff99e;
  undefined1 in_stack_fffffffffffff99f;
  ElementsAddressFactory *in_stack_fffffffffffff9a0;
  undefined4 in_stack_fffffffffffff9a8;
  AssertHelper local_630;
  Message local_628 [2];
  Address local_611;
  byte local_459;
  ConstCharPtr local_458;
  AssertHelper local_450;
  Message local_448 [3];
  ByteData local_430 [16];
  byte local_299;
  ConstCharPtr local_298;
  AssertHelper local_290;
  Message local_288;
  undefined4 local_280;
  AddressType local_27c;
  AssertionResult local_278;
  AssertHelper local_268;
  Message local_260;
  ByteData local_258;
  string local_240;
  AssertionResult local_220;
  allocator local_209;
  string local_208;
  ByteData local_1e8;
  Address local_1d0;
  
  cfd::core::GetElementsAddressFormatList();
  cfd::ElementsAddressFactory::ElementsAddressFactory
            (in_stack_fffffffffffff9a0,
             CONCAT13(in_stack_fffffffffffff99f,
                      CONCAT12(in_stack_fffffffffffff99e,
                               CONCAT11(in_stack_fffffffffffff99d,in_stack_fffffffffffff99c))),
             (vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *)
             in_stack_fffffffffffff990);
  std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::~vector
            ((vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *)
             in_stack_fffffffffffff9a0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_208,"c4d571179a455b8976b79cf99183fd2bbafe6bfd",&local_209);
  cfd::core::ByteData::ByteData(&local_1e8,&local_208);
  cfd::AddressFactory::GetSegwitAddressByHash
            ((AddressFactory *)
             CONCAT17(in_stack_fffffffffffff99f,
                      CONCAT16(in_stack_fffffffffffff99e,
                               CONCAT15(in_stack_fffffffffffff99d,
                                        CONCAT14(in_stack_fffffffffffff99c,in_stack_fffffffffffff998
                                                )))),(ByteData *)in_stack_fffffffffffff990);
  cfd::core::ByteData::~ByteData((ByteData *)0x1f50f7);
  std::__cxx11::string::~string((string *)&local_208);
  std::allocator<char>::~allocator((allocator<char> *)&local_209);
  cfd::core::Address::GetHash(in_stack_fffffffffffff988);
  cfd::core::ByteData::GetHex_abi_cxx11_(&local_240,&local_258);
  pcVar5 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_220,"address.GetHash().GetHex().c_str()",
             "\"c4d571179a455b8976b79cf99183fd2bbafe6bfd\"",pcVar5,
             "c4d571179a455b8976b79cf99183fd2bbafe6bfd");
  std::__cxx11::string::~string((string *)&local_240);
  cfd::core::ByteData::~ByteData((ByteData *)0x1f518d);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_220);
  if (!bVar1) {
    testing::Message::Message(&local_260);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)0x1f52db);
    testing::internal::AssertHelper::AssertHelper
              (&local_268,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_elements_address.cpp"
               ,0xa3,pcVar5);
    testing::internal::AssertHelper::operator=(&local_268,&local_260);
    testing::internal::AssertHelper::~AssertHelper(&local_268);
    testing::Message::~Message((Message *)0x1f5338);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1f5390);
  local_27c = cfd::core::Address::GetAddressType(&local_1d0);
  local_280 = 4;
  testing::internal::EqHelper<false>::Compare<cfd::core::AddressType,cfd::core::AddressType>
            ((char *)CONCAT44(local_27c,in_stack_fffffffffffff9a8),(char *)in_stack_fffffffffffff9a0
             ,(AddressType *)
              CONCAT17(in_stack_fffffffffffff99f,
                       CONCAT16(in_stack_fffffffffffff99e,
                                CONCAT15(in_stack_fffffffffffff99d,
                                         CONCAT14(in_stack_fffffffffffff99c,
                                                  in_stack_fffffffffffff998)))),
             (AddressType *)in_stack_fffffffffffff990);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_278);
  if (!bVar1) {
    testing::Message::Message(&local_288);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)0x1f544f);
    testing::internal::AssertHelper::AssertHelper
              (&local_290,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_elements_address.cpp"
               ,0xa4,pcVar5);
    testing::internal::AssertHelper::operator=(&local_290,&local_288);
    testing::internal::AssertHelper::~AssertHelper(&local_290);
    testing::Message::~Message((Message *)0x1f54ac);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1f5504);
  testing::internal::ConstCharPtr::ConstCharPtr(&local_298,"");
  uVar2 = testing::internal::ConstCharPtr::operator_cast_to_bool(&local_298);
  if ((bool)uVar2) {
    local_299 = 0;
    in_stack_fffffffffffff99e = testing::internal::AlwaysTrue();
    if ((bool)in_stack_fffffffffffff99e) {
      cfd::core::ByteData::ByteData(local_430);
      cfd::AddressFactory::GetSegwitAddressByHash
                ((AddressFactory *)
                 CONCAT17(uVar2,CONCAT16(in_stack_fffffffffffff99e,
                                         CONCAT15(in_stack_fffffffffffff99d,
                                                  CONCAT14(in_stack_fffffffffffff99c,
                                                           in_stack_fffffffffffff998)))),
                 (ByteData *)in_stack_fffffffffffff990);
      cfd::core::Address::~Address(in_stack_fffffffffffff990);
      cfd::core::ByteData::~ByteData((ByteData *)0x1f55a2);
    }
    if ((local_299 & 1) == 0) {
      local_298.value =
           "Expected: factory.GetSegwitAddressByHash(ByteData()) throws an exception of type CfdException.\n  Actual: it throws nothing."
      ;
      goto LAB_001f567a;
    }
  }
  else {
LAB_001f567a:
    testing::Message::Message(local_448);
    testing::internal::AssertHelper::AssertHelper
              (&local_450,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_elements_address.cpp"
               ,0xa6,local_298.value);
    testing::internal::AssertHelper::operator=(&local_450,local_448);
    testing::internal::AssertHelper::~AssertHelper(&local_450);
    testing::Message::~Message((Message *)0x1f56e2);
  }
  testing::internal::ConstCharPtr::ConstCharPtr(&local_458,"");
  uVar3 = testing::internal::ConstCharPtr::operator_cast_to_bool(&local_458);
  if ((bool)uVar3) {
    local_459 = 0;
    uVar4 = testing::internal::AlwaysTrue();
    if ((bool)uVar4) {
      in_stack_fffffffffffff990 = &local_611;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)((long)&local_611.type_ + 1),"0000",
                 (allocator *)in_stack_fffffffffffff990);
      cfd::core::ByteData::ByteData
                ((ByteData *)((long)local_611.address_.field_2._M_local_buf + 1),
                 (string *)((long)&local_611.type_ + 1));
      cfd::AddressFactory::GetSegwitAddressByHash
                ((AddressFactory *)
                 CONCAT17(uVar2,CONCAT16(in_stack_fffffffffffff99e,
                                         CONCAT15(uVar3,CONCAT14(uVar4,in_stack_fffffffffffff998))))
                 ,(ByteData *)in_stack_fffffffffffff990);
      cfd::core::Address::~Address(in_stack_fffffffffffff990);
      cfd::core::ByteData::~ByteData((ByteData *)0x1f57f7);
      std::__cxx11::string::~string((string *)((long)&local_611.type_ + 1));
      std::allocator<char>::~allocator((allocator<char> *)&local_611);
    }
    if ((local_459 & 1) != 0) goto LAB_001f59a6;
    local_458.value =
         "Expected: factory.GetSegwitAddressByHash(ByteData(\"0000\")) throws an exception of type CfdException.\n  Actual: it throws nothing."
    ;
  }
  testing::Message::Message(local_628);
  testing::internal::AssertHelper::AssertHelper
            (&local_630,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_elements_address.cpp"
             ,0xa7,local_458.value);
  testing::internal::AssertHelper::operator=(&local_630,local_628);
  testing::internal::AssertHelper::~AssertHelper(&local_630);
  testing::Message::~Message((Message *)0x1f5964);
LAB_001f59a6:
  cfd::core::Address::~Address(in_stack_fffffffffffff990);
  cfd::ElementsAddressFactory::~ElementsAddressFactory((ElementsAddressFactory *)0x1f59c0);
  return;
}

Assistant:

TEST(ElementsAddressFactory, GetSegwitAddressByHash)
{
  {
    ElementsAddressFactory factory(NetType::kElementsRegtest, GetElementsAddressFormatList());
    Address address = factory.GetSegwitAddressByHash(ByteData("c4d571179a455b8976b79cf99183fd2bbafe6bfd"));
    EXPECT_STREQ(address.GetHash().GetHex().c_str(), "c4d571179a455b8976b79cf99183fd2bbafe6bfd");
    EXPECT_EQ(address.GetAddressType(), AddressType::kP2wpkhAddress);

    EXPECT_THROW(factory.GetSegwitAddressByHash(ByteData()), CfdException);
    EXPECT_THROW(factory.GetSegwitAddressByHash(ByteData("0000")), CfdException);
  }
}